

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O2

void sexp_insert_timed(sexp_conflict ctx,sexp_conflict thread,sexp_conflict timeout)

{
  sexp_conflict psVar1;
  sexp_tag_t sVar2;
  long lVar3;
  sexp_conflict psVar4;
  long lVar5;
  sexp_conflict psVar6;
  sexp_conflict **pppsVar7;
  double __x;
  double dVar8;
  
  sexp_delete_list(ctx,(int)thread,timeout);
  psVar4 = (sexp_conflict)(((ctx->value).type.setters)->value).context.mark_stack[10].end;
  if (((ulong)timeout & 1) == 0) {
    if (((ulong)timeout & 2) == 0) {
      sVar2 = timeout->tag;
      if (sVar2 - 0xb < 3) {
        gettimeofday((timeval *)&(thread->value).context.tval,(__timezone_ptr_t)0x0);
        sVar2 = timeout->tag;
      }
      if (sVar2 == 0xb) {
        __x = (timeout->value).flonum;
LAB_0010273b:
        dVar8 = trunc(__x);
        lVar3 = (long)((double)(thread->value).context.tval.tv_sec + dVar8);
        (thread->value).context.tval.tv_sec = lVar3;
        lVar5 = (long)((__x - dVar8) * 1000000.0 + (double)(thread->value).context.tval.tv_usec);
        (thread->value).context.tval.tv_usec = lVar5;
        if (1000000 < lVar5) {
          lVar3 = lVar3 + 1;
          (thread->value).context.tval.tv_sec = lVar3;
          lVar5 = lVar5 + -1000000;
LAB_001027a2:
          (thread->value).context.tval.tv_usec = lVar5;
        }
      }
      else {
        if (sVar2 == 0xd) {
          __x = (double)sexp_ratio_to_double(ctx,timeout);
          goto LAB_0010273b;
        }
        if (sVar2 == 0x24) {
          lVar3 = (timeout->value).context.tval.tv_sec;
          (thread->value).context.tval.tv_sec = lVar3;
          lVar5 = (timeout->value).context.tval.tv_usec;
          goto LAB_001027a2;
        }
        (thread->value).context.tval.tv_sec = 0;
        (thread->value).context.tval.tv_usec = 0;
        lVar3 = 0;
      }
      if (((ulong)timeout->tag < 0x25) && ((0x1000003800U >> ((ulong)timeout->tag & 0x3f) & 1) != 0)
         ) goto LAB_001027dc;
    }
    else {
      (thread->value).context.tval.tv_sec = 0;
      (thread->value).context.tval.tv_usec = 0;
    }
    psVar6 = (sexp_conflict)0x23e;
    while (((((ulong)psVar4 & 3) == 0 && (psVar4->tag == 6)) &&
           (*(long *)((long)&((psVar4->value).type.name)->value + 0x6090) != 0))) {
      psVar6 = psVar4;
      psVar4 = *(sexp_conflict *)((long)&psVar4->value + 8);
    }
  }
  else {
    gettimeofday((timeval *)&(thread->value).context.tval,(__timezone_ptr_t)0x0);
    lVar3 = ((long)timeout >> 1) + (thread->value).context.tval.tv_sec;
    (thread->value).context.tval.tv_sec = lVar3;
LAB_001027dc:
    psVar6 = (sexp_conflict)0x23e;
    for (; (((ulong)psVar4 & 3) == 0 && (psVar4->tag == 6));
        psVar4 = *(sexp_conflict *)((long)&psVar4->value + 8)) {
      psVar1 = (psVar4->value).type.name;
      lVar5 = *(long *)((long)&psVar1->value + 0x6090);
      if (((lVar5 == 0) && (*(long *)((long)&psVar1->value + 0x6098) == 0)) ||
         ((lVar3 <= lVar5 &&
          ((lVar5 != lVar3 ||
           ((thread->value).context.tval.tv_usec <= *(long *)((long)&psVar1->value + 0x6098)))))))
      break;
      psVar6 = psVar4;
    }
  }
  psVar4 = (sexp_conflict)sexp_cons_op(ctx,0,2,thread,psVar4);
  if (psVar6 == (sexp_conflict)0x23e) {
    pppsVar7 = &(((ctx->value).type.setters)->value).context.mark_stack[10].end;
  }
  else {
    pppsVar7 = (sexp_conflict **)((long)&psVar6->value + 8);
  }
  *pppsVar7 = (sexp_conflict *)psVar4;
  return;
}

Assistant:

static void sexp_insert_timed (sexp ctx, sexp thread, sexp timeout) {
#if SEXP_USE_FLONUMS
  double d;
#endif
  sexp ls1=SEXP_NULL, ls2;
  sexp_delete_list(ctx, SEXP_G_THREADS_PAUSED, thread);
  ls2 = sexp_global(ctx, SEXP_G_THREADS_PAUSED);
  if (sexp_realp(timeout))
    gettimeofday(&sexp_context_timeval(thread), NULL);
  if (sexp_fixnump(timeout)) {
    sexp_context_timeval(thread).tv_sec += sexp_unbox_fixnum(timeout);
#if SEXP_USE_FLONUMS
  } else if (sexp_flonump(timeout)) {
    d = sexp_flonum_value(timeout);
    sexp_context_timeval(thread).tv_sec += trunc(d);
    sexp_context_timeval(thread).tv_usec += (d-trunc(d))*1000000;
    if (sexp_context_timeval(thread).tv_usec > 1000000) {
      sexp_context_timeval(thread).tv_sec += 1;
      sexp_context_timeval(thread).tv_usec -= 1000000;
    }
#endif
#if SEXP_USE_RATIOS
  } else if (sexp_ratiop(timeout)) {
    d = sexp_ratio_to_double(ctx, timeout);
    sexp_context_timeval(thread).tv_sec += trunc(d);
    sexp_context_timeval(thread).tv_usec += (d-trunc(d))*1000000;
    if (sexp_context_timeval(thread).tv_usec > 1000000) {
      sexp_context_timeval(thread).tv_sec += 1;
      sexp_context_timeval(thread).tv_usec -= 1000000;
    }
#endif
  } else if (sexp_contextp(timeout)) {
    sexp_context_timeval(thread).tv_sec = sexp_context_timeval(timeout).tv_sec;
    sexp_context_timeval(thread).tv_usec = sexp_context_timeval(timeout).tv_usec;
  } else {
    sexp_context_timeval(thread).tv_sec = 0;
    sexp_context_timeval(thread).tv_usec = 0;
  }
  if (sexp_realp(timeout) || sexp_contextp(timeout))
    while (sexp_pairp(ls2)
           && sexp_context_before(sexp_car(ls2), sexp_context_timeval(thread)))
      ls1=ls2, ls2=sexp_cdr(ls2);
  else
    while (sexp_pairp(ls2) && sexp_context_timeval(sexp_car(ls2)).tv_sec)
      ls1=ls2, ls2=sexp_cdr(ls2);
  if (ls1 == SEXP_NULL)
    sexp_global(ctx, SEXP_G_THREADS_PAUSED) = sexp_cons(ctx, thread, ls2);
  else
    sexp_cdr(ls1) = sexp_cons(ctx, thread, ls2);
}